

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter.c
# Opt level: O1

int aom_stop_encode(aom_writer *w)

{
  od_ec_enc *enc;
  int iVar1;
  undefined8 in_RAX;
  uchar *__src;
  uint32_t bytes;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  enc = &w->ec;
  __src = od_ec_enc_done(enc,&local_24);
  if (__src == (uchar *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = od_ec_enc_tell(enc);
    memcpy(w->buffer,__src,(ulong)local_24);
    w->pos = local_24;
  }
  od_ec_enc_clear(enc);
  return iVar1;
}

Assistant:

int aom_stop_encode(aom_writer *w) {
  int nb_bits;
  uint32_t bytes;
  unsigned char *data;
  data = od_ec_enc_done(&w->ec, &bytes);
  if (!data) {
    od_ec_enc_clear(&w->ec);
    return -1;
  }
  nb_bits = od_ec_enc_tell(&w->ec);
  memcpy(w->buffer, data, bytes);
  w->pos = bytes;
  od_ec_enc_clear(&w->ec);
  return nb_bits;
}